

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::move(Tree *this,size_t node,size_t new_parent,size_t after)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  csubstr cVar10;
  char msg [29];
  char *pcStack_100;
  size_t local_f8;
  char *pcStack_d8;
  size_t local_d0;
  char *pcStack_b0;
  size_t local_a8;
  char *pcStack_88;
  size_t local_80;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_38;
  size_t local_30;
  
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(msg + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_30 = cVar10.len;
    pcStack_38 = cVar10.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x653d) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x653d) << 0x40,8);
    LVar3.name.str = pcStack_38;
    LVar3.name.len = local_30;
    (*p_Var1)(msg,0x1d,LVar3,(this->m_callbacks).m_user_data);
  }
  if (node == after) {
    builtin_strncpy(msg + 0x10,"ode != after)",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_58 = cVar10.len;
    pcStack_60 = cVar10.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x653e) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x653e) << 0x40,8);
    LVar4.name.str = pcStack_60;
    LVar4.name.len = local_58;
    (*p_Var1)(msg,0x1e,LVar4,(this->m_callbacks).m_user_data);
  }
  if (new_parent == 0xffffffffffffffff) {
    builtin_strncpy(msg + 0x10,"ew_parent != ",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_80 = cVar10.len;
    pcStack_88 = cVar10.str;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x653f) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x653f) << 0x40,8);
    LVar5.name.str = pcStack_88;
    LVar5.name.len = local_80;
    (*p_Var1)(msg,0x23,LVar5,(this->m_callbacks).m_user_data);
  }
  if (new_parent == node) {
    builtin_strncpy(msg + 0x10,"ew_parent != ",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_a8 = cVar10.len;
    pcStack_b0 = cVar10.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6540) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x6540) << 0x40,8);
    LVar6.name.str = pcStack_b0;
    LVar6.name.len = local_a8;
    (*p_Var1)(msg,0x23,LVar6,(this->m_callbacks).m_user_data);
  }
  if (new_parent == after) {
    builtin_strncpy(msg + 0x10,"ew_parent != ",0xd);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_d0 = cVar10.len;
    pcStack_d8 = cVar10.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6541) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x6541) << 0x40,8);
    LVar7.name.str = pcStack_d8;
    LVar7.name.len = local_d0;
    (*p_Var1)(msg,0x24,LVar7,(this->m_callbacks).m_user_data);
  }
  bVar9 = is_root(this,node);
  if (bVar9) {
    builtin_strncpy(msg + 0x10," is_root(node",0xd);
    builtin_strncpy(msg,"check failed: (!",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar9 = is_debugger_attached();
      if (bVar9) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_f8 = cVar10.len;
    pcStack_100 = cVar10.str;
    LVar8.super_LineCol.col = 0;
    LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6542) << 0x40,0);
    LVar8.super_LineCol.line = SUB168(ZEXT816(0x6542) << 0x40,8);
    LVar8.name.str = pcStack_100;
    LVar8.name.len = local_f8;
    (*p_Var1)(msg,0x20,LVar8,(this->m_callbacks).m_user_data);
  }
  _rem_hierarchy(this,node);
  _set_hierarchy(this,node,new_parent,after);
  return;
}

Assistant:

void Tree::move(size_t node, size_t new_parent, size_t after)
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    _RYML_CB_ASSERT(m_callbacks, node != after);
    _RYML_CB_ASSERT(m_callbacks, new_parent != NONE);
    _RYML_CB_ASSERT(m_callbacks, new_parent != node);
    _RYML_CB_ASSERT(m_callbacks, new_parent != after);
    _RYML_CB_ASSERT(m_callbacks,  ! is_root(node));

    _rem_hierarchy(node);
    _set_hierarchy(node, new_parent, after);
}